

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O1

void __thiscall
llama_kv_cache_unified::llama_kv_cache_unified
          (llama_kv_cache_unified *this,llama_hparams *hparams,callbacks *cbs)

{
  undefined8 uVar1;
  
  (this->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i =
       (_func_int **)&PTR_clear_00286c80;
  (this->defrag_info).ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->defrag_info).ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->defrag_info).ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pending).ranges.
  super__Vector_base<llama_kv_cache_unified::slot_range,_std::allocator<llama_kv_cache_unified::slot_range>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pending).ranges.
  super__Vector_base<llama_kv_cache_unified::slot_range,_std::allocator<llama_kv_cache_unified::slot_range>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pending).ranges.
  super__Vector_base<llama_kv_cache_unified::slot_range,_std::allocator<llama_kv_cache_unified::slot_range>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->hparams = hparams;
  *(undefined8 *)&(this->cbs).get_rope_factors.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->cbs).get_rope_factors.super__Function_base._M_functor + 8) = 0;
  (this->cbs).get_rope_factors.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->cbs).get_rope_factors._M_invoker = (cbs->get_rope_factors)._M_invoker;
  if ((cbs->get_rope_factors).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(cbs->get_rope_factors).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->cbs).get_rope_factors.super__Function_base._M_functor =
         *(undefined8 *)&(cbs->get_rope_factors).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->cbs).get_rope_factors.super__Function_base._M_functor + 8) = uVar1
    ;
    (this->cbs).get_rope_factors.super__Function_base._M_manager =
         (cbs->get_rope_factors).super__Function_base._M_manager;
    (cbs->get_rope_factors).super__Function_base._M_manager = (_Manager_type)0x0;
    (cbs->get_rope_factors)._M_invoker = (_Invoker_type)0x0;
  }
  this->has_shift = false;
  this->do_defrag = false;
  this->recurrent = false;
  this->v_trans = true;
  this->can_shift = false;
  this->head = 0;
  this->size = 0;
  this->used = 0;
  this->n = 0;
  (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->k_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->k_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->k_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->v_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->v_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->v_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->type_k = GGML_TYPE_F16;
  this->type_v = GGML_TYPE_F16;
  (this->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

llama_kv_cache_unified::llama_kv_cache_unified(const llama_hparams & hparams, callbacks cbs) : hparams(hparams), cbs(std::move(cbs)) {
}